

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_length<char16_t,char>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  size_t sVar1;
  jessilib *pjVar2;
  jessilib *pjVar3;
  char32_t cVar4;
  char16_t *pcVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  size_t local_40;
  
  pcVar7 = in_prefix._M_str;
  pjVar2 = (jessilib *)in_prefix._M_len;
  pcVar5 = in_string._M_str;
  sVar6 = in_string._M_len;
  pjVar3 = pjVar2;
  if (pjVar2 == (jessilib *)0x0 || sVar6 == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    do {
      cVar4 = (char32_t)(ushort)*pcVar5;
      lVar8 = 1;
      if (((sVar6 != 1) && ((cVar4 & 0xfc00U) == 0xd800)) &&
         (((ushort)pcVar5[1] & 0xfc00) == 0xdc00)) {
        cVar4 = (uint)(ushort)*pcVar5 * 0x400 + (uint)(ushort)pcVar5[1] + L'\xfca02400';
        lVar8 = 2;
      }
      in_string_00._M_str = (char *)pjVar2;
      in_string_00._M_len = (size_t)pcVar7;
      dVar9 = decode_codepoint_utf8<char>(pjVar3,in_string_00);
      pjVar2 = (jessilib *)dVar9.units;
      if (pjVar2 == (jessilib *)0x0) {
        return 0;
      }
      if (cVar4 != dVar9.codepoint) {
        return 0;
      }
      pjVar3 = pjVar3 + -(long)pjVar2;
      sVar1 = sVar1 + lVar8;
      sVar6 = sVar6 - lVar8;
      if (sVar6 == 0) break;
      pcVar5 = pcVar5 + lVar8;
      pcVar7 = pcVar7 + (long)pjVar2;
    } while (pjVar3 != (jessilib *)0x0);
  }
  local_40 = 0;
  if (pjVar3 == (jessilib *)0x0) {
    local_40 = sVar1;
  }
  return local_40;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}